

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O0

string * google::protobuf::compiler::js::(anonymous_namespace)::JSIdent_abi_cxx11_
                   (GeneratorOptions *options,FieldDescriptor *field,bool is_upper_camel,bool is_map
                   ,bool drop_list)

{
  Type TVar1;
  Descriptor *pDVar2;
  byte in_CL;
  FieldDescriptor *in_RDX;
  string *in_RDI;
  byte in_R8B;
  byte in_R9B;
  bool bVar3;
  string *result;
  string *in_stack_fffffffffffffec0;
  string *in_stack_fffffffffffffed0;
  string *in_stack_ffffffffffffff18;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffff28;
  string local_b0 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffff58;
  string local_50 [52];
  undefined1 local_1c;
  byte local_1b;
  byte local_1a;
  byte local_19;
  FieldDescriptor *local_18;
  
  local_19 = in_CL & 1;
  local_1a = in_R8B & 1;
  local_1b = in_R9B & 1;
  local_1c = 0;
  local_18 = in_RDX;
  std::__cxx11::string::string((string *)in_RDI);
  TVar1 = FieldDescriptor::type((FieldDescriptor *)in_stack_fffffffffffffed0);
  if (TVar1 == TYPE_GROUP) {
    bVar3 = (local_19 & 1) == 0;
    if (bVar3) {
      pDVar2 = FieldDescriptor::message_type((FieldDescriptor *)in_stack_fffffffffffffec0);
      in_stack_fffffffffffffed0 = Descriptor::name_abi_cxx11_(pDVar2);
      anon_unknown_0::ParseUpperCamel(in_stack_ffffffffffffff18);
      anon_unknown_0::ToLowerCamel(in_stack_ffffffffffffff58);
    }
    else {
      pDVar2 = FieldDescriptor::message_type((FieldDescriptor *)in_stack_fffffffffffffec0);
      Descriptor::name_abi_cxx11_(pDVar2);
      anon_unknown_0::ParseUpperCamel(in_stack_ffffffffffffff18);
      anon_unknown_0::ToUpperCamel(in_stack_ffffffffffffff28);
    }
    std::__cxx11::string::operator=((string *)in_RDI,local_50);
    std::__cxx11::string::~string(local_50);
    if (bVar3) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_fffffffffffffed0);
    }
    else {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_fffffffffffffed0);
    }
  }
  else {
    bVar3 = (local_19 & 1) == 0;
    if (bVar3) {
      in_stack_fffffffffffffec0 = FieldDescriptor::name_abi_cxx11_(local_18);
      anon_unknown_0::ParseLowerUnderscore(in_stack_ffffffffffffff18);
      anon_unknown_0::ToLowerCamel(in_stack_ffffffffffffff58);
    }
    else {
      FieldDescriptor::name_abi_cxx11_(local_18);
      anon_unknown_0::ParseLowerUnderscore(in_stack_ffffffffffffff18);
      anon_unknown_0::ToUpperCamel(in_stack_ffffffffffffff28);
    }
    std::__cxx11::string::operator=((string *)in_RDI,local_b0);
    std::__cxx11::string::~string(local_b0);
    if (bVar3) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_fffffffffffffed0);
    }
    else {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_fffffffffffffed0);
    }
  }
  if (((local_1a & 1) != 0) ||
     (bVar3 = FieldDescriptor::is_map((FieldDescriptor *)in_stack_fffffffffffffec0), bVar3)) {
    std::__cxx11::string::operator+=((string *)in_RDI,"Map");
  }
  else if (((local_1b & 1) == 0) &&
          (bVar3 = FieldDescriptor::is_repeated((FieldDescriptor *)0x476a8f), bVar3)) {
    std::__cxx11::string::operator+=((string *)in_RDI,"List");
  }
  return in_RDI;
}

Assistant:

std::string JSIdent(const GeneratorOptions& options,
                    const FieldDescriptor* field, bool is_upper_camel,
                    bool is_map, bool drop_list) {
  std::string result;
  if (field->type() == FieldDescriptor::TYPE_GROUP) {
    result = is_upper_camel
                 ? ToUpperCamel(ParseUpperCamel(field->message_type()->name()))
                 : ToLowerCamel(ParseUpperCamel(field->message_type()->name()));
  } else {
    result = is_upper_camel ? ToUpperCamel(ParseLowerUnderscore(field->name()))
                            : ToLowerCamel(ParseLowerUnderscore(field->name()));
  }
  if (is_map || field->is_map()) {
    // JSPB-style or proto3-style map.
    result += "Map";
  } else if (!drop_list && field->is_repeated()) {
    // Repeated field.
    result += "List";
  }
  return result;
}